

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O3

bool __thiscall
ON_3dmObjectAttributes::UpdateReferencedComponents
          (ON_3dmObjectAttributes *this,ON_ComponentManifest *source_manifest,
          ON_ComponentManifest *destination_manifest,ON_ManifestMap *manifest_map)

{
  bool bVar1;
  bool bVar2;
  long in_RAX;
  ulong uVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  int destination_layer_index;
  undefined8 uStack_38;
  
  if (this->m_layer_index < 0) {
    bVar1 = true;
    uStack_38 = in_RAX;
  }
  else {
    piVar5 = (int *)((long)&uStack_38 + 4);
    uStack_38._0_4_ = (undefined4)in_RAX;
    uStack_38 = CONCAT44(0x80000001,(undefined4)uStack_38);
    bVar1 = ON_ManifestMap::GetAndValidateDestinationIndex
                      (manifest_map,Layer,this->m_layer_index,destination_manifest,piVar5);
    if (!bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_attributes.cpp"
                 ,0x11b,"","Unable to update layer reference.");
      piVar5 = &DefaultAttributes.m_layer_index;
    }
    this->m_layer_index = *piVar5;
  }
  if (-1 < this->m_material_index) {
    piVar5 = (int *)((long)&uStack_38 + 4);
    uStack_38 = CONCAT44(0x80000001,(undefined4)uStack_38);
    bVar2 = ON_ManifestMap::GetAndValidateDestinationIndex
                      (manifest_map,Material,this->m_material_index,destination_manifest,piVar5);
    if (!bVar2) {
      bVar1 = false;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_attributes.cpp"
                 ,299,"","Unable to update render material reference.");
      piVar5 = &DefaultAttributes.m_material_index;
    }
    this->m_material_index = *piVar5;
  }
  if (-1 < this->m_linetype_index) {
    piVar5 = (int *)((long)&uStack_38 + 4);
    uStack_38 = CONCAT44(0x80000001,(undefined4)uStack_38);
    bVar2 = ON_ManifestMap::GetAndValidateDestinationIndex
                      (manifest_map,LinePattern,this->m_linetype_index,destination_manifest,piVar5);
    if (!bVar2) {
      bVar1 = false;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_attributes.cpp"
                 ,0x13b,"","Unable to update line pattern reference.");
      piVar5 = &DefaultAttributes.m_linetype_index;
    }
    this->m_linetype_index = *piVar5;
  }
  if ((this->m_group).m_count == 0) {
    iVar4 = 0;
  }
  else {
    uVar3 = 0;
    uVar6 = 0;
    do {
      uStack_38 = CONCAT44(0x80000001,(undefined4)uStack_38);
      bVar2 = ON_ManifestMap::GetAndValidateDestinationIndex
                        (manifest_map,Group,(this->m_group).m_a[uVar3],destination_manifest,
                         (int *)((long)&uStack_38 + 4));
      if (bVar2) {
        if (uStack_38 < 0) {
          iVar4 = 0x14f;
          goto LAB_0036b92b;
        }
        (this->m_group).m_a[uVar6] = uStack_38._4_4_;
        uVar6 = (ulong)((int)uVar6 + 1);
      }
      else {
        iVar4 = 0x149;
LAB_0036b92b:
        bVar1 = false;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_attributes.cpp"
                   ,iVar4,"","Unable to update group reference.");
      }
      iVar4 = (int)uVar6;
      uVar3 = uVar3 + 1;
    } while (uVar3 < (uint)(this->m_group).m_count);
  }
  if ((-1 < iVar4) && (iVar4 <= (this->m_group).m_capacity)) {
    (this->m_group).m_count = iVar4;
  }
  return bVar1;
}

Assistant:

bool ON_3dmObjectAttributes::UpdateReferencedComponents(
  const class ON_ComponentManifest& source_manifest,
  const class ON_ComponentManifest& destination_manifest,
  const class ON_ManifestMap& manifest_map
  )
{
  bool rc = true;

  // Update layer reference
  if (m_layer_index >= 0)
  {
    int destination_layer_index = ON_UNSET_INT_INDEX;
    if (manifest_map.GetAndValidateDestinationIndex(ON_ModelComponent::Type::Layer, m_layer_index, destination_manifest, &destination_layer_index))
    {
      m_layer_index = destination_layer_index;
    }
    else
    {
      ON_ERROR("Unable to update layer reference.");
      rc = false;
      m_layer_index = ON_3dmObjectAttributes::DefaultAttributes.m_layer_index;
    }
  }

  // Update render material reference
  if (m_material_index >= 0)
  {
    int destination_material_index = ON_UNSET_INT_INDEX;
    if (manifest_map.GetAndValidateDestinationIndex(ON_ModelComponent::Type::RenderMaterial, m_material_index, destination_manifest, &destination_material_index))
    {
      m_material_index = destination_material_index;
    }
    else
    {
      ON_ERROR("Unable to update render material reference.");
      rc = false;
      m_material_index = ON_3dmObjectAttributes::DefaultAttributes.m_material_index;
    }
  }

  // Update line pattern reference
  if (m_linetype_index >= 0)
  {
    int destination_line_pattern_index = ON_UNSET_INT_INDEX;
    if (manifest_map.GetAndValidateDestinationIndex(ON_ModelComponent::Type::LinePattern, m_linetype_index, destination_manifest, &destination_line_pattern_index))
    {
      m_linetype_index = destination_line_pattern_index;
    }
    else
    {
      ON_ERROR("Unable to update line pattern reference.");
      rc = false;
      m_linetype_index = ON_3dmObjectAttributes::DefaultAttributes.m_linetype_index;
    }
  }

  // Update group references
  unsigned int group_count = 0;
  for (unsigned int i = 0; i < m_group.UnsignedCount(); i++)
  {
    int group_index = m_group[i];
    int destination_group_index_index = ON_UNSET_INT_INDEX;
    if (!manifest_map.GetAndValidateDestinationIndex(ON_ModelComponent::Type::Group, group_index, destination_manifest, &destination_group_index_index))
    {
      ON_ERROR("Unable to update group reference.");
      rc = false;
      continue;
    }
    if (destination_group_index_index < 0)
    {
      ON_ERROR("Unable to update group reference.");
      rc = false;
      continue;
    }
    m_group[group_count] = destination_group_index_index;
    group_count++;
  }
  m_group.SetCount(group_count);

  return rc;
}